

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

counting_iterator
fmt::v9::detail::write_escaped_string<char,fmt::v9::detail::counting_iterator>
          (counting_iterator out,basic_string_view<char> str)

{
  iterator pcVar1;
  size_t in_RDI;
  find_escape_result<char> *in_stack_00000020;
  counting_iterator in_stack_00000028;
  find_escape_result<char> escape;
  iterator end;
  iterator begin;
  counting_iterator *in_stack_ffffffffffffff68;
  counting_iterator local_90;
  undefined7 in_stack_ffffffffffffff78;
  char in_stack_ffffffffffffff7f;
  counting_iterator in_stack_ffffffffffffff80;
  counting_iterator in_stack_ffffffffffffff88;
  counting_iterator in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  iterator local_58;
  counting_iterator local_30;
  value_type local_22;
  char local_21;
  basic_string_view<char> local_20;
  size_t local_10;
  
  local_21 = '\"';
  local_10 = in_RDI;
  local_30 = counting_iterator::operator++(in_stack_ffffffffffffff68,0);
  counting_iterator::operator*(&local_30);
  counting_iterator::value_type::operator=(&local_22,&local_21);
  basic_string_view<char>::begin(&local_20);
  pcVar1 = basic_string_view<char>::end(&local_20);
  do {
    find_escape(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98.count_);
    in_stack_ffffffffffffff80 =
         copy_str<char,char_const*,fmt::v9::detail::counting_iterator>
                   (in_stack_ffffffffffffff80.count_,
                    (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                    in_stack_ffffffffffffff88);
    local_10 = in_stack_ffffffffffffff80.count_;
    if (local_58 == (iterator)0x0) break;
    in_stack_ffffffffffffff98 = in_stack_ffffffffffffff80;
    in_stack_ffffffffffffff88 =
         write_escaped_cp<fmt::v9::detail::counting_iterator,char>
                   (in_stack_00000028,in_stack_00000020);
    local_10 = in_stack_ffffffffffffff88.count_;
  } while (local_58 != pcVar1);
  local_90 = counting_iterator::operator++(in_stack_ffffffffffffff68,0);
  counting_iterator::operator*(&local_90);
  counting_iterator::value_type::operator=
            ((value_type *)&stack0xffffffffffffff7e,&stack0xffffffffffffff7f);
  return (counting_iterator)local_10;
}

Assistant:

auto write_escaped_string(OutputIt out, basic_string_view<Char> str)
    -> OutputIt {
  *out++ = static_cast<Char>('"');
  auto begin = str.begin(), end = str.end();
  do {
    auto escape = find_escape(begin, end);
    out = copy_str<Char>(begin, escape.begin, out);
    begin = escape.end;
    if (!begin) break;
    out = write_escaped_cp<OutputIt, Char>(out, escape);
  } while (begin != end);
  *out++ = static_cast<Char>('"');
  return out;
}